

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool CoreML::Specification::ArrayFeatureType_ArrayDataType_IsValid(int value)

{
  if ((((0x30 < value - 0x10010U) ||
       ((0x1000000010001U >> ((ulong)(value - 0x10010U) & 0x3f) & 1) == 0)) && (value != 0)) &&
     (value != 0x20020)) {
    return false;
  }
  return true;
}

Assistant:

bool ArrayFeatureType_ArrayDataType_IsValid(int value) {
  switch (value) {
    case 0:
    case 65552:
    case 65568:
    case 65600:
    case 131104:
      return true;
    default:
      return false;
  }
}